

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Maj3_ManVarMapPrint(Maj3_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  uint local_118 [2];
  int Levels [32];
  int Firsts [32];
  int k;
  int i;
  Maj3_Man_t *p_local;
  
  Maj3_ManFirstAndLevel(p->vLevels,Levels + 0x1e,(int *)local_118,p->nVars,p->nObjs);
  uVar1 = p->nVars;
  uVar2 = p->nNodes;
  uVar3 = Vec_IntSize(p->vLevels);
  printf("Variable map for problem with %d inputs, %d nodes and %d levels: ",(ulong)uVar1,
         (ulong)uVar2,(ulong)uVar3);
  Vec_IntPrint(p->vLevels);
  printf("    ");
  printf("      ");
  for (Firsts[0x1f] = 0; Firsts[0x1f] < p->nObjs; Firsts[0x1f] = Firsts[0x1f] + 1) {
    printf("%3d  ",(ulong)(uint)Firsts[0x1f]);
  }
  printf("\n");
  Firsts[0x1f] = p->nObjs;
  while (Firsts[0x1f] = Firsts[0x1f] + -1, p->nVars <= Firsts[0x1f]) {
    printf(" %2d ",(ulong)(uint)Firsts[0x1f]);
    printf(" %2d   ",(ulong)(uint)Levels[(long)Firsts[0x1f] + -2]);
    for (Firsts[0x1e] = 0; Firsts[0x1e] < p->nObjs; Firsts[0x1e] = Firsts[0x1e] + 1) {
      if (p->VarMarks[Firsts[0x1f]][Firsts[0x1e]] == -1) {
        printf("  .  ");
      }
      else if (p->VarMarks[Firsts[0x1f]][Firsts[0x1e]] == 1) {
        printf("  +  ");
      }
      else {
        uVar1 = p->VarMarks[Firsts[0x1f]][Firsts[0x1e]];
        iVar4 = bmcg_sat_solver_read_cex_varvalue(p->pSat,p->VarMarks[Firsts[0x1f]][Firsts[0x1e]]);
        uVar5 = 0x20;
        if (iVar4 != 0) {
          uVar5 = 0x2b;
        }
        printf("%3d%c ",(ulong)uVar1,uVar5);
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Maj3_ManVarMapPrint( Maj3_Man_t * p )
{
    int i, k, Firsts[MAJ3_OBJS], Levels[MAJ3_OBJS];
    Maj3_ManFirstAndLevel( p->vLevels, Firsts, Levels, p->nVars, p->nObjs );
    // print
    printf( "Variable map for problem with %d inputs, %d nodes and %d levels: ", p->nVars, p->nNodes, Vec_IntSize(p->vLevels) );
    Vec_IntPrint( p->vLevels );
    printf( "    " );
    printf( "      " );
    for ( i = 0; i < p->nObjs; i++ )
        printf( "%3d  ", i );
    printf( "\n" );
    for ( i = p->nObjs-1; i >= p->nVars; i-- )
    {
        printf( " %2d ", i );
        printf( " %2d   ", Levels[i] );
        for ( k = 0; k < p->nObjs; k++ )
            if ( p->VarMarks[i][k] == -1 )
                printf( "  .  " );
            else if ( p->VarMarks[i][k] == 1 )
                printf( "  +  " );
            else 
                printf( "%3d%c ", p->VarMarks[i][k], bmcg_sat_solver_read_cex_varvalue(p->pSat, p->VarMarks[i][k]) ? '+' : ' ' );
        printf( "\n" );
    }
}